

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::double_writer::operator()(double_writer *this,wchar_t **it)

{
  double_writer dVar1;
  wchar_t *pwVar2;
  char *__first;
  wchar_t *pwVar3;
  
  dVar1 = this[8];
  pwVar2 = *it;
  pwVar3 = pwVar2;
  if (dVar1 != (double_writer)0x0) {
    pwVar3 = pwVar2 + 1;
    *it = pwVar3;
    *pwVar2 = (int)(char)dVar1;
    *(long *)this = *(long *)this + -1;
  }
  __first = *(char **)(*(long *)(this + 0x10) + 8);
  pwVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char*,wchar_t*>
                     (__first,__first + *(long *)(*(long *)(this + 0x10) + 0x10),pwVar3);
  *it = pwVar3;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }